

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O3

int ndn_signed_interest_ecdsa_verify(ndn_interest_t *interest,ndn_ecc_pub_t *pub_key)

{
  byte bVar1;
  uint32_t input_size;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint8_t uVar7;
  byte bVar8;
  ndn_interest_t *component;
  uint uVar9;
  uint8_t local_2f8 [692];
  uint local_44;
  undefined1 local_40 [8];
  ndn_encoder_t temp_encoder;
  
  bVar8 = interest->flags;
  if (-1 < (char)bVar8) {
    return -0x11;
  }
  bVar1 = (interest->name).components_size;
  if ((interest->name).components[(ulong)bVar1 - 1].type != 2) {
    return -0x11;
  }
  local_44 = 0;
  memset(local_2f8,0,0x2a8);
  temp_encoder.output_value = (uint8_t *)0x2a8;
  local_40 = (undefined1  [8])local_2f8;
  if (1 < bVar1) {
    uVar9 = 1;
    component = interest;
    do {
      iVar2 = name_component_tlv_encode((ndn_encoder_t *)local_40,(name_component_t *)component);
      if (iVar2 != 0) {
        return iVar2;
      }
      uVar4 = uVar9 & 0xff;
      component = (ndn_interest_t *)((component->name).components + 1);
      uVar9 = uVar4 + 1;
    } while ((int)uVar4 < (int)((interest->name).components_size - 1));
    local_44 = temp_encoder.output_value._4_4_;
    bVar8 = interest->flags;
  }
  if ((bVar8 & 0x40) != 0) {
    if ((uint)temp_encoder.output_value == local_44) {
      return -0xe;
    }
    *(uint8_t *)((long)local_40 + (ulong)local_44) = '$';
    uVar5 = temp_encoder.output_value._4_4_ + 1;
    uVar9 = (interest->parameters).size;
    iVar2 = 1;
    uVar4 = uVar5;
    if (0xfc < uVar9 || (uint)temp_encoder.output_value == uVar5) {
      if (uVar9 < 0x10000 && 2 < (uint)temp_encoder.output_value - uVar5) {
        iVar2 = 3;
        iVar3 = 2;
        iVar6 = 1;
        uVar7 = 0xfd;
      }
      else {
        if ((uint)temp_encoder.output_value - uVar5 < 5) {
          return -0xe;
        }
        *(uint8_t *)((long)local_40 + (ulong)uVar5) = 0xfe;
        *(uint8_t *)((long)local_40 + (ulong)(temp_encoder.output_value._4_4_ + 2)) =
             (uint8_t)(uVar9 >> 0x18);
        uVar7 = (uint8_t)(uVar9 >> 0x10);
        uVar4 = temp_encoder.output_value._4_4_ + 3;
        iVar2 = 5;
        iVar3 = 4;
        iVar6 = 3;
      }
      *(uint8_t *)((long)local_40 + (ulong)uVar4) = uVar7;
      *(uint8_t *)((long)local_40 + (ulong)(iVar6 + uVar5)) = (uint8_t)(uVar9 >> 8);
      uVar4 = iVar3 + uVar5;
    }
    *(uint8_t *)((long)local_40 + (ulong)uVar4) = (uint8_t)uVar9;
    uVar5 = iVar2 + uVar5;
    temp_encoder.output_value = (uint8_t *)CONCAT44(uVar5,(uint)temp_encoder.output_value);
    uVar9 = (interest->parameters).size;
    if ((int)((uint)temp_encoder.output_value - uVar5) < (int)uVar9) {
      return -10;
    }
    memcpy((uint8_t *)((long)local_40 + (ulong)uVar5),&interest->parameters,(ulong)uVar9);
    temp_encoder.output_value =
         (uint8_t *)
         CONCAT44(temp_encoder.output_value._4_4_ + uVar9,(uint)temp_encoder.output_value);
  }
  uVar9 = ndn_signature_info_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
  if (uVar9 == 0) {
    input_size = temp_encoder.output_value._4_4_;
    uVar9 = ndn_signature_value_tlv_encode((ndn_encoder_t *)local_40,&interest->signature);
    if ((uVar9 == 0) &&
       (uVar9 = ndn_ecdsa_verify((uint8_t *)local_40,input_size,(interest->signature).sig_value,
                                 (interest->signature).sig_size,pub_key), -1 < (int)uVar9)) {
      bVar8 = (interest->name).components_size;
      iVar2 = ndn_sha256_verify((uint8_t *)((long)local_40 + (ulong)local_44),
                                temp_encoder.output_value._4_4_ - local_44,
                                (interest->name).components[(ulong)bVar8 - 1].value,
                                (uint)(interest->name).components[(ulong)bVar8 - 1].size);
      uVar9 = iVar2 >> 0x1f & 0xffffffe2;
    }
  }
  return uVar9;
}

Assistant:

int
ndn_signed_interest_ecdsa_verify(const ndn_interest_t* interest, const ndn_ecc_pub_t* pub_key)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V) excluding the ending component
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_ecdsa_verify(temp_encoder.output_value, siginfo_block_ending,
                                interest->signature.sig_value, interest->signature.sig_size,
                                pub_key);
  if (result < 0) return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}